

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_ls.c
# Opt level: O3

int CVodeSetJacTimesRhsFnB(void *cvode_mem,int which,CVRhsFn jtimesRhsFn)

{
  int iVar1;
  CVodeBMem cvB_mem;
  CVLsMemB cvlsB_mem;
  CVadjMem ca_mem;
  CVodeMem cv_mem;
  CVodeBMem local_28;
  CVLsMemB local_20;
  CVadjMem local_18;
  CVodeMem local_10;
  
  iVar1 = cvLs_AccessLMemB(cvode_mem,which,"CVodeSetJacTimesRhsFnB",&local_10,&local_18,&local_28,
                           &local_20);
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = CVodeSetJacTimesRhsFn(local_28->cv_mem,jtimesRhsFn);
  return iVar1;
}

Assistant:

int CVodeSetJacTimesRhsFnB(void* cvode_mem, int which, CVRhsFn jtimesRhsFn)
{
  CVodeMem cv_mem;
  CVadjMem ca_mem;
  CVodeBMem cvB_mem;
  CVLsMemB cvlsB_mem;
  void* cvodeB_mem;
  int retval;

  /* access relevant memory structures */
  retval = cvLs_AccessLMemB(cvode_mem, which, __func__, &cv_mem, &ca_mem,
                            &cvB_mem, &cvlsB_mem);
  if (retval != CVLS_SUCCESS) { return (retval); }

  /* Call the corresponding "set" routine for the backward problem */
  cvodeB_mem = (void*)(cvB_mem->cv_mem);
  return (CVodeSetJacTimesRhsFn(cvodeB_mem, jtimesRhsFn));
}